

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O3

void duckdb::GenerateKeysInternal<false>
               (ArenaAllocator *allocator,DataChunk *input,unsafe_vector<ARTKey> *keys)

{
  size_t *psVar1;
  long *plVar2;
  PhysicalType PVar3;
  data_t dVar4;
  ushort uVar5;
  pointer pAVar6;
  ulong uVar7;
  undefined8 uVar8;
  bool bVar9;
  reference pvVar10;
  idx_t iVar11;
  ulong *puVar12;
  ushort *puVar13;
  uint *puVar14;
  data_ptr_t pdVar15;
  size_t __n;
  InternalException *pIVar16;
  uint uVar17;
  ulong uVar18;
  DataChunk *this;
  data_ptr_t pdVar19;
  idx_t iVar20;
  long lVar21;
  data_ptr_t pdVar22;
  idx_t iVar23;
  ARTKey AVar24;
  string_t value;
  string_t value_00;
  UnifiedVectorFormat data;
  ARTKey local_b0;
  data_ptr_t local_a0;
  DataChunk *local_98;
  data_ptr_t local_90;
  data_ptr_t local_88;
  undefined1 local_80 [16];
  SelectionVector local_70 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  idx_t local_38;
  
  pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  PVar3 = (pvVar10->type).physical_type_;
  local_98 = input;
  if (PVar3 < VARCHAR) {
    switch(PVar3) {
    case BOOL:
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar20 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
      Vector::ToUnifiedFormat(pvVar10,iVar20,(UnifiedVectorFormat *)local_80);
      uVar8 = local_80._8_8_;
      if (iVar20 != 0) {
        lVar21 = 0;
        iVar23 = 0;
        do {
          iVar11 = iVar23;
          if (*(long *)local_80._0_8_ != 0) {
            iVar11 = (idx_t)*(uint *)(*(long *)local_80._0_8_ + iVar23 * 4);
          }
          if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
             ((*(ulong *)((long)local_70[0].sel_vector + (iVar11 >> 6) * 8) >> (iVar11 & 0x3f) & 1)
              != 0)) {
            pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                     super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar4 = *(data_t *)(uVar8 + iVar11);
            pdVar22 = ArenaAllocator::Allocate(allocator,1);
            *pdVar22 = dVar4;
            *(data_ptr_t *)((long)&pAVar6->data + lVar21) = pdVar22;
            *(undefined8 *)((long)&pAVar6->len + lVar21) = 1;
          }
          else {
            ARTKey::ARTKey(&local_b0);
            psVar1 = (size_t *)
                     ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                              super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                              _M_impl.super__Vector_impl_data._M_start)->len + lVar21);
            *psVar1 = local_b0.len;
            psVar1[1] = (size_t)local_b0.data;
          }
          iVar23 = iVar23 + 1;
          lVar21 = lVar21 + 0x10;
        } while (iVar20 != iVar23);
      }
      break;
    case UINT8:
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar20 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
      Vector::ToUnifiedFormat(pvVar10,iVar20,(UnifiedVectorFormat *)local_80);
      uVar8 = local_80._8_8_;
      if (iVar20 != 0) {
        lVar21 = 0;
        iVar23 = 0;
        do {
          iVar11 = iVar23;
          if (*(long *)local_80._0_8_ != 0) {
            iVar11 = (idx_t)*(uint *)(*(long *)local_80._0_8_ + iVar23 * 4);
          }
          if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
             ((*(ulong *)((long)local_70[0].sel_vector + (iVar11 >> 6) * 8) >> (iVar11 & 0x3f) & 1)
              != 0)) {
            pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                     super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar4 = *(data_t *)(uVar8 + iVar11);
            pdVar22 = ArenaAllocator::Allocate(allocator,1);
            *pdVar22 = dVar4;
            *(data_ptr_t *)((long)&pAVar6->data + lVar21) = pdVar22;
            *(undefined8 *)((long)&pAVar6->len + lVar21) = 1;
          }
          else {
            ARTKey::ARTKey(&local_b0);
            psVar1 = (size_t *)
                     ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                              super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                              _M_impl.super__Vector_impl_data._M_start)->len + lVar21);
            *psVar1 = local_b0.len;
            psVar1[1] = (size_t)local_b0.data;
          }
          iVar23 = iVar23 + 1;
          lVar21 = lVar21 + 0x10;
        } while (iVar20 != iVar23);
      }
      break;
    case INT8:
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar20 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
      Vector::ToUnifiedFormat(pvVar10,iVar20,(UnifiedVectorFormat *)local_80);
      uVar8 = local_80._8_8_;
      if (iVar20 != 0) {
        lVar21 = 0;
        iVar23 = 0;
        do {
          iVar11 = iVar23;
          if (*(long *)local_80._0_8_ != 0) {
            iVar11 = (idx_t)*(uint *)(*(long *)local_80._0_8_ + iVar23 * 4);
          }
          if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
             ((*(ulong *)((long)local_70[0].sel_vector + (iVar11 >> 6) * 8) >> (iVar11 & 0x3f) & 1)
              != 0)) {
            pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                     super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar4 = *(data_ptr_t)(uVar8 + iVar11);
            pdVar22 = ArenaAllocator::Allocate(allocator,1);
            *pdVar22 = dVar4 + 0x80;
            *(data_ptr_t *)((long)&pAVar6->data + lVar21) = pdVar22;
            *(undefined8 *)((long)&pAVar6->len + lVar21) = 1;
          }
          else {
            ARTKey::ARTKey(&local_b0);
            psVar1 = (size_t *)
                     ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                              super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                              _M_impl.super__Vector_impl_data._M_start)->len + lVar21);
            *psVar1 = local_b0.len;
            psVar1[1] = (size_t)local_b0.data;
          }
          iVar23 = iVar23 + 1;
          lVar21 = lVar21 + 0x10;
        } while (iVar20 != iVar23);
      }
      break;
    case UINT16:
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar20 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
      Vector::ToUnifiedFormat(pvVar10,iVar20,(UnifiedVectorFormat *)local_80);
      uVar8 = local_80._8_8_;
      if (iVar20 != 0) {
        lVar21 = 0;
        iVar23 = 0;
        do {
          iVar11 = iVar23;
          if (*(long *)local_80._0_8_ != 0) {
            iVar11 = (idx_t)*(uint *)(*(long *)local_80._0_8_ + iVar23 * 4);
          }
          if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
             ((*(ulong *)((long)local_70[0].sel_vector + (iVar11 >> 6) * 8) >> (iVar11 & 0x3f) & 1)
              != 0)) {
            pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                     super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar5 = *(ushort *)(uVar8 + iVar11 * 2);
            puVar13 = (ushort *)ArenaAllocator::Allocate(allocator,2);
            *puVar13 = uVar5 << 8 | uVar5 >> 8;
            *(ushort **)((long)&pAVar6->data + lVar21) = puVar13;
            *(undefined8 *)((long)&pAVar6->len + lVar21) = 2;
          }
          else {
            ARTKey::ARTKey(&local_b0);
            psVar1 = (size_t *)
                     ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                              super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                              _M_impl.super__Vector_impl_data._M_start)->len + lVar21);
            *psVar1 = local_b0.len;
            psVar1[1] = (size_t)local_b0.data;
          }
          iVar23 = iVar23 + 1;
          lVar21 = lVar21 + 0x10;
        } while (iVar20 != iVar23);
      }
      break;
    case INT16:
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar20 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
      Vector::ToUnifiedFormat(pvVar10,iVar20,(UnifiedVectorFormat *)local_80);
      uVar8 = local_80._8_8_;
      if (iVar20 != 0) {
        lVar21 = 0;
        iVar23 = 0;
        do {
          iVar11 = iVar23;
          if (*(long *)local_80._0_8_ != 0) {
            iVar11 = (idx_t)*(uint *)(*(long *)local_80._0_8_ + iVar23 * 4);
          }
          if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
             ((*(ulong *)((long)local_70[0].sel_vector + (iVar11 >> 6) * 8) >> (iVar11 & 0x3f) & 1)
              != 0)) {
            pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                     super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar5 = *(ushort *)(uVar8 + iVar11 * 2);
            puVar13 = (ushort *)ArenaAllocator::Allocate(allocator,2);
            *puVar13 = uVar5 << 8 | uVar5 >> 8;
            *(data_t *)puVar13 = (char)(uVar5 >> 8) + 0x80;
            *(ushort **)((long)&pAVar6->data + lVar21) = puVar13;
            *(undefined8 *)((long)&pAVar6->len + lVar21) = 2;
          }
          else {
            ARTKey::ARTKey(&local_b0);
            psVar1 = (size_t *)
                     ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                              super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                              _M_impl.super__Vector_impl_data._M_start)->len + lVar21);
            *psVar1 = local_b0.len;
            psVar1[1] = (size_t)local_b0.data;
          }
          iVar23 = iVar23 + 1;
          lVar21 = lVar21 + 0x10;
        } while (iVar20 != iVar23);
      }
      break;
    case UINT32:
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar20 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
      Vector::ToUnifiedFormat(pvVar10,iVar20,(UnifiedVectorFormat *)local_80);
      uVar8 = local_80._8_8_;
      if (iVar20 != 0) {
        lVar21 = 0;
        iVar23 = 0;
        do {
          iVar11 = iVar23;
          if (*(long *)local_80._0_8_ != 0) {
            iVar11 = (idx_t)*(uint *)(*(long *)local_80._0_8_ + iVar23 * 4);
          }
          if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
             ((*(ulong *)((long)local_70[0].sel_vector + (iVar11 >> 6) * 8) >> (iVar11 & 0x3f) & 1)
              != 0)) {
            pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                     super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar17 = *(uint *)(uVar8 + iVar11 * 4);
            puVar14 = (uint *)ArenaAllocator::Allocate(allocator,4);
            *puVar14 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                       uVar17 << 0x18;
            *(uint **)((long)&pAVar6->data + lVar21) = puVar14;
            *(undefined8 *)((long)&pAVar6->len + lVar21) = 4;
          }
          else {
            ARTKey::ARTKey(&local_b0);
            psVar1 = (size_t *)
                     ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                              super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                              _M_impl.super__Vector_impl_data._M_start)->len + lVar21);
            *psVar1 = local_b0.len;
            psVar1[1] = (size_t)local_b0.data;
          }
          iVar23 = iVar23 + 1;
          lVar21 = lVar21 + 0x10;
        } while (iVar20 != iVar23);
      }
      break;
    case INT32:
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar20 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
      Vector::ToUnifiedFormat(pvVar10,iVar20,(UnifiedVectorFormat *)local_80);
      uVar8 = local_80._8_8_;
      if (iVar20 != 0) {
        lVar21 = 0;
        iVar23 = 0;
        do {
          iVar11 = iVar23;
          if (*(long *)local_80._0_8_ != 0) {
            iVar11 = (idx_t)*(uint *)(*(long *)local_80._0_8_ + iVar23 * 4);
          }
          if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
             ((*(ulong *)((long)local_70[0].sel_vector + (iVar11 >> 6) * 8) >> (iVar11 & 0x3f) & 1)
              != 0)) {
            pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                     super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar17 = *(uint *)(uVar8 + iVar11 * 4);
            puVar14 = (uint *)ArenaAllocator::Allocate(allocator,4);
            *puVar14 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                       uVar17 << 0x18;
            *(data_t *)puVar14 = (char)(uVar17 >> 0x18) + 0x80;
            *(uint **)((long)&pAVar6->data + lVar21) = puVar14;
            *(undefined8 *)((long)&pAVar6->len + lVar21) = 4;
          }
          else {
            ARTKey::ARTKey(&local_b0);
            psVar1 = (size_t *)
                     ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                              super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                              _M_impl.super__Vector_impl_data._M_start)->len + lVar21);
            *psVar1 = local_b0.len;
            psVar1[1] = (size_t)local_b0.data;
          }
          iVar23 = iVar23 + 1;
          lVar21 = lVar21 + 0x10;
        } while (iVar20 != iVar23);
      }
      break;
    case UINT64:
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar20 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
      Vector::ToUnifiedFormat(pvVar10,iVar20,(UnifiedVectorFormat *)local_80);
      uVar8 = local_80._8_8_;
      if (iVar20 != 0) {
        lVar21 = 0;
        iVar23 = 0;
        do {
          iVar11 = iVar23;
          if (*(long *)local_80._0_8_ != 0) {
            iVar11 = (idx_t)*(uint *)(*(long *)local_80._0_8_ + iVar23 * 4);
          }
          if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
             ((*(ulong *)((long)local_70[0].sel_vector + (iVar11 >> 6) * 8) >> (iVar11 & 0x3f) & 1)
              != 0)) {
            pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                     super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar18 = *(ulong *)(uVar8 + iVar11 * 8);
            puVar12 = (ulong *)ArenaAllocator::Allocate(allocator,8);
            *puVar12 = uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
                       (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
                       (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
                       (uVar18 & 0xff00) << 0x28 | uVar18 << 0x38;
            *(ulong **)((long)&pAVar6->data + lVar21) = puVar12;
            *(undefined8 *)((long)&pAVar6->len + lVar21) = 8;
          }
          else {
            ARTKey::ARTKey(&local_b0);
            psVar1 = (size_t *)
                     ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                              super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                              _M_impl.super__Vector_impl_data._M_start)->len + lVar21);
            *psVar1 = local_b0.len;
            psVar1[1] = (size_t)local_b0.data;
          }
          iVar23 = iVar23 + 1;
          lVar21 = lVar21 + 0x10;
        } while (iVar20 != iVar23);
      }
      break;
    case INT64:
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar20 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
      Vector::ToUnifiedFormat(pvVar10,iVar20,(UnifiedVectorFormat *)local_80);
      uVar8 = local_80._8_8_;
      if (iVar20 != 0) {
        lVar21 = 0;
        iVar23 = 0;
        do {
          iVar11 = iVar23;
          if (*(long *)local_80._0_8_ != 0) {
            iVar11 = (idx_t)*(uint *)(*(long *)local_80._0_8_ + iVar23 * 4);
          }
          if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
             ((*(ulong *)((long)local_70[0].sel_vector + (iVar11 >> 6) * 8) >> (iVar11 & 0x3f) & 1)
              != 0)) {
            pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                     super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar18 = *(ulong *)(uVar8 + iVar11 * 8);
            puVar12 = (ulong *)ArenaAllocator::Allocate(allocator,8);
            *puVar12 = uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
                       (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
                       (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
                       (uVar18 & 0xff00) << 0x28 | uVar18 << 0x38;
            *(data_t *)puVar12 = (char)(uVar18 >> 0x38) + 0x80;
            *(ulong **)((long)&pAVar6->data + lVar21) = puVar12;
            *(undefined8 *)((long)&pAVar6->len + lVar21) = 8;
          }
          else {
            ARTKey::ARTKey(&local_b0);
            psVar1 = (size_t *)
                     ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                              super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                              _M_impl.super__Vector_impl_data._M_start)->len + lVar21);
            *psVar1 = local_b0.len;
            psVar1[1] = (size_t)local_b0.data;
          }
          iVar23 = iVar23 + 1;
          lVar21 = lVar21 + 0x10;
        } while (iVar20 != iVar23);
      }
      break;
    default:
switchD_015ad4c9_caseD_a:
      pIVar16 = (InternalException *)__cxa_allocate_exception(0x10);
      local_80._0_8_ = local_70;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_80,"Invalid type for index","");
      InternalException::InternalException(pIVar16,(string *)local_80);
      __cxa_throw(pIVar16,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case FLOAT:
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar20 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
      Vector::ToUnifiedFormat(pvVar10,iVar20,(UnifiedVectorFormat *)local_80);
      uVar8 = local_80._8_8_;
      if (iVar20 != 0) {
        lVar21 = 0;
        iVar23 = 0;
        do {
          iVar11 = iVar23;
          if (*(long *)local_80._0_8_ != 0) {
            iVar11 = (idx_t)*(uint *)(*(long *)local_80._0_8_ + iVar23 * 4);
          }
          if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
             ((*(ulong *)((long)local_70[0].sel_vector + (iVar11 >> 6) * 8) >> (iVar11 & 0x3f) & 1)
              != 0)) {
            pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                     super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_88 = (data_ptr_t)CONCAT44(local_88._4_4_,*(undefined4 *)(uVar8 + iVar11 * 4));
            puVar14 = (uint *)ArenaAllocator::Allocate(allocator,4);
            if ((local_88._0_4_ != 0.0) || (uVar17 = 0x80000000, NAN(local_88._0_4_))) {
              bVar9 = Value::IsNan<float>(local_88._0_4_);
              uVar17 = 0xffffffff;
              if (((!bVar9) && (uVar17 = 0xfffffffe, local_88._0_4_ <= 3.4028235e+38)) &&
                 (uVar17 = 0, -3.4028235e+38 <= local_88._0_4_)) {
                uVar17 = ~(uint)local_88._0_4_;
                if (-1 < (int)local_88._0_4_) {
                  uVar17 = (uint)local_88._0_4_ | 0x80000000;
                }
              }
            }
            *puVar14 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                       uVar17 << 0x18;
            *(uint **)((long)&pAVar6->data + lVar21) = puVar14;
            *(undefined8 *)((long)&pAVar6->len + lVar21) = 4;
          }
          else {
            ARTKey::ARTKey(&local_b0);
            psVar1 = (size_t *)
                     ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                              super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                              _M_impl.super__Vector_impl_data._M_start)->len + lVar21);
            *psVar1 = local_b0.len;
            psVar1[1] = (size_t)local_b0.data;
          }
          iVar23 = iVar23 + 1;
          lVar21 = lVar21 + 0x10;
        } while (iVar20 != iVar23);
      }
      break;
    case DOUBLE:
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar20 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
      Vector::ToUnifiedFormat(pvVar10,iVar20,(UnifiedVectorFormat *)local_80);
      uVar8 = local_80._8_8_;
      if (iVar20 != 0) {
        lVar21 = 0;
        iVar23 = 0;
        do {
          iVar11 = iVar23;
          if (*(long *)local_80._0_8_ != 0) {
            iVar11 = (idx_t)*(uint *)(*(long *)local_80._0_8_ + iVar23 * 4);
          }
          if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
             ((*(ulong *)((long)local_70[0].sel_vector + (iVar11 >> 6) * 8) >> (iVar11 & 0x3f) & 1)
              != 0)) {
            pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                     super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_88 = *(data_ptr_t *)(uVar8 + iVar11 * 8);
            puVar12 = (ulong *)ArenaAllocator::Allocate(allocator,8);
            if (((double)local_88 != 0.0) || (uVar18 = 0x8000000000000000, NAN((double)local_88))) {
              bVar9 = Value::IsNan<double>((double)local_88);
              uVar18 = 0xffffffffffffffff;
              if ((!bVar9) &&
                 (uVar18 = 0xfffffffffffffffe, (double)local_88 <= 1.79769313486232e+308)) {
                if (-1.79769313486232e+308 <= (double)local_88) {
                  uVar18 = ~(ulong)local_88;
                  if (-1 < (long)local_88) {
                    uVar18 = (ulong)local_88 | 0x8000000000000000;
                  }
                }
                else {
                  uVar18 = 0;
                }
              }
            }
            *puVar12 = uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
                       (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
                       (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
                       (uVar18 & 0xff00) << 0x28 | uVar18 << 0x38;
            *(ulong **)((long)&pAVar6->data + lVar21) = puVar12;
            *(undefined8 *)((long)&pAVar6->len + lVar21) = 8;
          }
          else {
            ARTKey::ARTKey(&local_b0);
            psVar1 = (size_t *)
                     ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                              super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                              _M_impl.super__Vector_impl_data._M_start)->len + lVar21);
            *psVar1 = local_b0.len;
            psVar1[1] = (size_t)local_b0.data;
          }
          iVar23 = iVar23 + 1;
          lVar21 = lVar21 + 0x10;
        } while (iVar20 != iVar23);
      }
LAB_015af645:
      this = local_98;
      if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
        this = local_98;
      }
      goto joined_r0x015af669;
    }
  }
  else {
    if (PVar3 == VARCHAR) {
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar20 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
      Vector::ToUnifiedFormat(pvVar10,iVar20,(UnifiedVectorFormat *)local_80);
      uVar8 = local_80._8_8_;
      if (iVar20 != 0) {
        lVar21 = 0;
        iVar23 = 0;
        do {
          iVar11 = iVar23;
          if (*(long *)local_80._0_8_ != 0) {
            iVar11 = (idx_t)*(uint *)(*(long *)local_80._0_8_ + iVar23 * 4);
          }
          if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
             ((*(ulong *)((long)local_70[0].sel_vector + (iVar11 >> 6) * 8) >> (iVar11 & 0x3f) & 1)
              != 0)) {
            pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                     super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                     super__Vector_impl_data._M_start;
            value_00.value.pointer.ptr = (char *)keys;
            value_00.value._0_8_ = *(undefined8 *)(uVar8 + iVar11 * 0x10 + 8);
            AVar24 = ARTKey::CreateARTKey<duckdb::string_t>
                               ((ARTKey *)allocator,*(ArenaAllocator **)(uVar8 + iVar11 * 0x10),
                                value_00);
            *(idx_t *)((long)&pAVar6->len + lVar21) = AVar24.len;
            *(data_ptr_t *)((long)&pAVar6->data + lVar21) = AVar24.data;
          }
          else {
            ARTKey::ARTKey(&local_b0);
            psVar1 = (size_t *)
                     ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                              super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                              _M_impl.super__Vector_impl_data._M_start)->len + lVar21);
            *psVar1 = local_b0.len;
            psVar1[1] = (size_t)local_b0.data;
          }
          iVar23 = iVar23 + 1;
          lVar21 = lVar21 + 0x10;
        } while (iVar20 != iVar23);
      }
      goto LAB_015af645;
    }
    if (PVar3 == UINT128) {
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar20 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
      Vector::ToUnifiedFormat(pvVar10,iVar20,(UnifiedVectorFormat *)local_80);
      if (iVar20 != 0) {
        local_88 = (data_ptr_t)local_80._8_8_;
        lVar21 = 0;
        iVar23 = 0;
        do {
          iVar11 = iVar23;
          if (*(long *)local_80._0_8_ != 0) {
            iVar11 = (idx_t)*(uint *)(*(long *)local_80._0_8_ + iVar23 * 4);
          }
          if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
             ((*(ulong *)((long)local_70[0].sel_vector + (iVar11 >> 6) * 8) >> (iVar11 & 0x3f) & 1)
              != 0)) {
            pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                     super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar18 = *(ulong *)(local_88 + iVar11 * 0x10);
            uVar7 = *(ulong *)(local_88 + iVar11 * 0x10 + 8);
            puVar12 = (ulong *)ArenaAllocator::Allocate(allocator,0x10);
            *puVar12 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                       (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                       (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                       (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
            puVar12[1] = uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
                         (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
                         (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
                         (uVar18 & 0xff00) << 0x28 | uVar18 << 0x38;
            *(ulong **)((long)&pAVar6->data + lVar21) = puVar12;
            *(undefined8 *)((long)&pAVar6->len + lVar21) = 0x10;
          }
          else {
            ARTKey::ARTKey(&local_b0);
            psVar1 = (size_t *)
                     ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                              super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                              _M_impl.super__Vector_impl_data._M_start)->len + lVar21);
            *psVar1 = local_b0.len;
            psVar1[1] = (size_t)local_b0.data;
          }
          iVar23 = iVar23 + 1;
          lVar21 = lVar21 + 0x10;
        } while (iVar20 != iVar23);
      }
    }
    else {
      if (PVar3 != INT128) goto switchD_015ad4c9_caseD_a;
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar20 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
      Vector::ToUnifiedFormat(pvVar10,iVar20,(UnifiedVectorFormat *)local_80);
      if (iVar20 != 0) {
        local_88 = (data_ptr_t)local_80._8_8_;
        lVar21 = 0;
        iVar23 = 0;
        do {
          iVar11 = iVar23;
          if (*(long *)local_80._0_8_ != 0) {
            iVar11 = (idx_t)*(uint *)(*(long *)local_80._0_8_ + iVar23 * 4);
          }
          if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
             ((*(ulong *)((long)local_70[0].sel_vector + (iVar11 >> 6) * 8) >> (iVar11 & 0x3f) & 1)
              != 0)) {
            pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                     super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar18 = *(ulong *)(local_88 + iVar11 * 0x10);
            uVar7 = *(ulong *)(local_88 + iVar11 * 0x10 + 8);
            puVar12 = (ulong *)ArenaAllocator::Allocate(allocator,0x10);
            *puVar12 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                       (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                       (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                       (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
            *(data_t *)puVar12 = (char)(uVar7 >> 0x38) + 0x80;
            puVar12[1] = uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
                         (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
                         (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
                         (uVar18 & 0xff00) << 0x28 | uVar18 << 0x38;
            *(ulong **)((long)&pAVar6->data + lVar21) = puVar12;
            *(undefined8 *)((long)&pAVar6->len + lVar21) = 0x10;
          }
          else {
            ARTKey::ARTKey(&local_b0);
            psVar1 = (size_t *)
                     ((long)&((keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                              super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                              _M_impl.super__Vector_impl_data._M_start)->len + lVar21);
            *psVar1 = local_b0.len;
            psVar1[1] = (size_t)local_b0.data;
          }
          iVar23 = iVar23 + 1;
          lVar21 = lVar21 + 0x10;
        } while (iVar20 != iVar23);
      }
    }
  }
  this = local_98;
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
    this = local_98;
  }
joined_r0x015af669:
  local_98 = this;
  if (local_70[0].selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70[0].selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (1 < (ulong)(((long)(this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)(this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5)) {
    pdVar22 = &DAT_00000001;
    do {
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&this->data,(size_type)pdVar22);
      PVar3 = (pvVar10->type).physical_type_;
      local_88 = pdVar22;
      if (PVar3 < VARCHAR) {
        switch(PVar3) {
        case BOOL:
          pvVar10 = vector<duckdb::Vector,_true>::operator[](&this->data,(size_type)pdVar22);
          pdVar22 = (data_ptr_t)this->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
          Vector::ToUnifiedFormat(pvVar10,(idx_t)pdVar22,(UnifiedVectorFormat *)local_80);
          if (pdVar22 != (data_ptr_t)0x0) {
            local_a0 = (data_ptr_t)local_80._8_8_;
            lVar21 = 0;
            pdVar19 = (data_ptr_t)0x0;
            local_90 = pdVar22;
            do {
              pdVar15 = pdVar19;
              if (*(long *)local_80._0_8_ != 0) {
                pdVar15 = (data_ptr_t)(ulong)*(uint *)(*(long *)local_80._0_8_ + (long)pdVar19 * 4);
              }
              if (*(long *)((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21) != 0)
              {
                if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
                   ((*(ulong *)((long)local_70[0].sel_vector + ((ulong)pdVar15 >> 6) * 8) >>
                     ((ulong)pdVar15 & 0x3f) & 1) != 0)) {
                  dVar4 = local_a0[(long)pdVar15];
                  pdVar22 = ArenaAllocator::Allocate(allocator,1);
                  *pdVar22 = dVar4;
                  ARTKey::ARTKey(&local_b0,pdVar22,1);
                  pdVar22 = local_b0.data;
                  iVar20 = local_b0.len;
                  pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                           super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  pdVar15 = ArenaAllocator::Allocate
                                      (allocator,
                                       *(long *)((long)&pAVar6->len + lVar21) + local_b0.len);
                  switchD_012b9b0d::default
                            (pdVar15,*(void **)((long)&pAVar6->data + lVar21),
                             *(size_t *)((long)&pAVar6->len + lVar21));
                  switchD_012b9b0d::default
                            (pdVar15 + *(long *)((long)&pAVar6->len + lVar21),pdVar22,iVar20);
                  plVar2 = (long *)((long)&pAVar6->len + lVar21);
                  *plVar2 = *plVar2 + iVar20;
                  *(data_ptr_t *)((long)&pAVar6->data + lVar21) = pdVar15;
                  pdVar22 = local_90;
                }
                else {
                  ARTKey::ARTKey(&local_b0);
                  psVar1 = (size_t *)
                           ((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21);
                  *psVar1 = local_b0.len;
                  psVar1[1] = (size_t)local_b0.data;
                }
              }
              pdVar19 = pdVar19 + 1;
              lVar21 = lVar21 + 0x10;
            } while (pdVar22 != pdVar19);
          }
          break;
        case UINT8:
          pvVar10 = vector<duckdb::Vector,_true>::operator[](&this->data,(size_type)pdVar22);
          pdVar22 = (data_ptr_t)this->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
          Vector::ToUnifiedFormat(pvVar10,(idx_t)pdVar22,(UnifiedVectorFormat *)local_80);
          if (pdVar22 != (data_ptr_t)0x0) {
            local_a0 = (data_ptr_t)local_80._8_8_;
            lVar21 = 0;
            pdVar19 = (data_ptr_t)0x0;
            local_90 = pdVar22;
            do {
              pdVar15 = pdVar19;
              if (*(long *)local_80._0_8_ != 0) {
                pdVar15 = (data_ptr_t)(ulong)*(uint *)(*(long *)local_80._0_8_ + (long)pdVar19 * 4);
              }
              if (*(long *)((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21) != 0)
              {
                if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
                   ((*(ulong *)((long)local_70[0].sel_vector + ((ulong)pdVar15 >> 6) * 8) >>
                     ((ulong)pdVar15 & 0x3f) & 1) != 0)) {
                  dVar4 = local_a0[(long)pdVar15];
                  pdVar22 = ArenaAllocator::Allocate(allocator,1);
                  *pdVar22 = dVar4;
                  ARTKey::ARTKey(&local_b0,pdVar22,1);
                  pdVar22 = local_b0.data;
                  iVar20 = local_b0.len;
                  pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                           super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  pdVar15 = ArenaAllocator::Allocate
                                      (allocator,
                                       *(long *)((long)&pAVar6->len + lVar21) + local_b0.len);
                  switchD_012b9b0d::default
                            (pdVar15,*(void **)((long)&pAVar6->data + lVar21),
                             *(size_t *)((long)&pAVar6->len + lVar21));
                  switchD_012b9b0d::default
                            (pdVar15 + *(long *)((long)&pAVar6->len + lVar21),pdVar22,iVar20);
                  plVar2 = (long *)((long)&pAVar6->len + lVar21);
                  *plVar2 = *plVar2 + iVar20;
                  *(data_ptr_t *)((long)&pAVar6->data + lVar21) = pdVar15;
                  pdVar22 = local_90;
                }
                else {
                  ARTKey::ARTKey(&local_b0);
                  psVar1 = (size_t *)
                           ((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21);
                  *psVar1 = local_b0.len;
                  psVar1[1] = (size_t)local_b0.data;
                }
              }
              pdVar19 = pdVar19 + 1;
              lVar21 = lVar21 + 0x10;
            } while (pdVar22 != pdVar19);
          }
          break;
        case INT8:
          pvVar10 = vector<duckdb::Vector,_true>::operator[](&this->data,(size_type)pdVar22);
          pdVar22 = (data_ptr_t)this->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
          Vector::ToUnifiedFormat(pvVar10,(idx_t)pdVar22,(UnifiedVectorFormat *)local_80);
          if (pdVar22 != (data_ptr_t)0x0) {
            local_a0 = (data_ptr_t)local_80._8_8_;
            lVar21 = 0;
            pdVar19 = (data_ptr_t)0x0;
            local_90 = pdVar22;
            do {
              pdVar15 = pdVar19;
              if (*(long *)local_80._0_8_ != 0) {
                pdVar15 = (data_ptr_t)(ulong)*(uint *)(*(long *)local_80._0_8_ + (long)pdVar19 * 4);
              }
              if (*(long *)((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21) != 0)
              {
                if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
                   ((*(ulong *)((long)local_70[0].sel_vector + ((ulong)pdVar15 >> 6) * 8) >>
                     ((ulong)pdVar15 & 0x3f) & 1) != 0)) {
                  dVar4 = local_a0[(long)pdVar15];
                  pdVar22 = ArenaAllocator::Allocate(allocator,1);
                  *pdVar22 = dVar4 + 0x80;
                  ARTKey::ARTKey(&local_b0,pdVar22,1);
                  pdVar22 = local_b0.data;
                  iVar20 = local_b0.len;
                  pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                           super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  pdVar15 = ArenaAllocator::Allocate
                                      (allocator,
                                       *(long *)((long)&pAVar6->len + lVar21) + local_b0.len);
                  switchD_012b9b0d::default
                            (pdVar15,*(void **)((long)&pAVar6->data + lVar21),
                             *(size_t *)((long)&pAVar6->len + lVar21));
                  switchD_012b9b0d::default
                            (pdVar15 + *(long *)((long)&pAVar6->len + lVar21),pdVar22,iVar20);
                  plVar2 = (long *)((long)&pAVar6->len + lVar21);
                  *plVar2 = *plVar2 + iVar20;
                  *(data_ptr_t *)((long)&pAVar6->data + lVar21) = pdVar15;
                  pdVar22 = local_90;
                }
                else {
                  ARTKey::ARTKey(&local_b0);
                  psVar1 = (size_t *)
                           ((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21);
                  *psVar1 = local_b0.len;
                  psVar1[1] = (size_t)local_b0.data;
                }
              }
              pdVar19 = pdVar19 + 1;
              lVar21 = lVar21 + 0x10;
            } while (pdVar22 != pdVar19);
          }
          break;
        case UINT16:
          pvVar10 = vector<duckdb::Vector,_true>::operator[](&this->data,(size_type)pdVar22);
          pdVar22 = (data_ptr_t)this->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
          Vector::ToUnifiedFormat(pvVar10,(idx_t)pdVar22,(UnifiedVectorFormat *)local_80);
          if (pdVar22 != (data_ptr_t)0x0) {
            local_a0 = (data_ptr_t)local_80._8_8_;
            lVar21 = 0;
            pdVar19 = (data_ptr_t)0x0;
            local_90 = pdVar22;
            do {
              pdVar15 = pdVar19;
              if (*(long *)local_80._0_8_ != 0) {
                pdVar15 = (data_ptr_t)(ulong)*(uint *)(*(long *)local_80._0_8_ + (long)pdVar19 * 4);
              }
              if (*(long *)((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21) != 0)
              {
                if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
                   ((*(ulong *)((long)local_70[0].sel_vector + ((ulong)pdVar15 >> 6) * 8) >>
                     ((ulong)pdVar15 & 0x3f) & 1) != 0)) {
                  uVar5 = *(ushort *)(local_a0 + (long)pdVar15 * 2);
                  puVar13 = (ushort *)ArenaAllocator::Allocate(allocator,2);
                  *puVar13 = uVar5 << 8 | uVar5 >> 8;
                  ARTKey::ARTKey(&local_b0,(data_ptr_t)puVar13,2);
                  pdVar22 = local_b0.data;
                  iVar20 = local_b0.len;
                  pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                           super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  pdVar15 = ArenaAllocator::Allocate
                                      (allocator,
                                       *(long *)((long)&pAVar6->len + lVar21) + local_b0.len);
                  switchD_012b9b0d::default
                            (pdVar15,*(void **)((long)&pAVar6->data + lVar21),
                             *(size_t *)((long)&pAVar6->len + lVar21));
                  switchD_012b9b0d::default
                            (pdVar15 + *(long *)((long)&pAVar6->len + lVar21),pdVar22,iVar20);
                  plVar2 = (long *)((long)&pAVar6->len + lVar21);
                  *plVar2 = *plVar2 + iVar20;
                  *(data_ptr_t *)((long)&pAVar6->data + lVar21) = pdVar15;
                  pdVar22 = local_90;
                }
                else {
                  ARTKey::ARTKey(&local_b0);
                  psVar1 = (size_t *)
                           ((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21);
                  *psVar1 = local_b0.len;
                  psVar1[1] = (size_t)local_b0.data;
                }
              }
              pdVar19 = pdVar19 + 1;
              lVar21 = lVar21 + 0x10;
            } while (pdVar22 != pdVar19);
          }
          break;
        case INT16:
          pvVar10 = vector<duckdb::Vector,_true>::operator[](&this->data,(size_type)pdVar22);
          pdVar22 = (data_ptr_t)this->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
          Vector::ToUnifiedFormat(pvVar10,(idx_t)pdVar22,(UnifiedVectorFormat *)local_80);
          if (pdVar22 != (data_ptr_t)0x0) {
            local_a0 = (data_ptr_t)local_80._8_8_;
            lVar21 = 0;
            pdVar19 = (data_ptr_t)0x0;
            local_90 = pdVar22;
            do {
              pdVar15 = pdVar19;
              if (*(long *)local_80._0_8_ != 0) {
                pdVar15 = (data_ptr_t)(ulong)*(uint *)(*(long *)local_80._0_8_ + (long)pdVar19 * 4);
              }
              if (*(long *)((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21) != 0)
              {
                if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
                   ((*(ulong *)((long)local_70[0].sel_vector + ((ulong)pdVar15 >> 6) * 8) >>
                     ((ulong)pdVar15 & 0x3f) & 1) != 0)) {
                  uVar5 = *(ushort *)(local_a0 + (long)pdVar15 * 2);
                  puVar13 = (ushort *)ArenaAllocator::Allocate(allocator,2);
                  *puVar13 = uVar5 << 8 | uVar5 >> 8;
                  *(data_t *)puVar13 = (char)(uVar5 >> 8) + 0x80;
                  ARTKey::ARTKey(&local_b0,(data_ptr_t)puVar13,2);
                  pdVar22 = local_b0.data;
                  iVar20 = local_b0.len;
                  pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                           super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  pdVar15 = ArenaAllocator::Allocate
                                      (allocator,
                                       *(long *)((long)&pAVar6->len + lVar21) + local_b0.len);
                  switchD_012b9b0d::default
                            (pdVar15,*(void **)((long)&pAVar6->data + lVar21),
                             *(size_t *)((long)&pAVar6->len + lVar21));
                  switchD_012b9b0d::default
                            (pdVar15 + *(long *)((long)&pAVar6->len + lVar21),pdVar22,iVar20);
                  plVar2 = (long *)((long)&pAVar6->len + lVar21);
                  *plVar2 = *plVar2 + iVar20;
                  *(data_ptr_t *)((long)&pAVar6->data + lVar21) = pdVar15;
                  pdVar22 = local_90;
                }
                else {
                  ARTKey::ARTKey(&local_b0);
                  psVar1 = (size_t *)
                           ((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21);
                  *psVar1 = local_b0.len;
                  psVar1[1] = (size_t)local_b0.data;
                }
              }
              pdVar19 = pdVar19 + 1;
              lVar21 = lVar21 + 0x10;
            } while (pdVar22 != pdVar19);
          }
          break;
        case UINT32:
          pvVar10 = vector<duckdb::Vector,_true>::operator[](&this->data,(size_type)pdVar22);
          pdVar22 = (data_ptr_t)this->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
          Vector::ToUnifiedFormat(pvVar10,(idx_t)pdVar22,(UnifiedVectorFormat *)local_80);
          if (pdVar22 != (data_ptr_t)0x0) {
            local_a0 = (data_ptr_t)local_80._8_8_;
            lVar21 = 0;
            pdVar19 = (data_ptr_t)0x0;
            local_90 = pdVar22;
            do {
              pdVar15 = pdVar19;
              if (*(long *)local_80._0_8_ != 0) {
                pdVar15 = (data_ptr_t)(ulong)*(uint *)(*(long *)local_80._0_8_ + (long)pdVar19 * 4);
              }
              if (*(long *)((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21) != 0)
              {
                if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
                   ((*(ulong *)((long)local_70[0].sel_vector + ((ulong)pdVar15 >> 6) * 8) >>
                     ((ulong)pdVar15 & 0x3f) & 1) != 0)) {
                  uVar17 = *(uint *)(local_a0 + (long)pdVar15 * 4);
                  puVar14 = (uint *)ArenaAllocator::Allocate(allocator,4);
                  *puVar14 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                             uVar17 << 0x18;
                  ARTKey::ARTKey(&local_b0,(data_ptr_t)puVar14,4);
                  pdVar22 = local_b0.data;
                  iVar20 = local_b0.len;
                  pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                           super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  pdVar15 = ArenaAllocator::Allocate
                                      (allocator,
                                       *(long *)((long)&pAVar6->len + lVar21) + local_b0.len);
                  switchD_012b9b0d::default
                            (pdVar15,*(void **)((long)&pAVar6->data + lVar21),
                             *(size_t *)((long)&pAVar6->len + lVar21));
                  switchD_012b9b0d::default
                            (pdVar15 + *(long *)((long)&pAVar6->len + lVar21),pdVar22,iVar20);
                  plVar2 = (long *)((long)&pAVar6->len + lVar21);
                  *plVar2 = *plVar2 + iVar20;
                  *(data_ptr_t *)((long)&pAVar6->data + lVar21) = pdVar15;
                  pdVar22 = local_90;
                }
                else {
                  ARTKey::ARTKey(&local_b0);
                  psVar1 = (size_t *)
                           ((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21);
                  *psVar1 = local_b0.len;
                  psVar1[1] = (size_t)local_b0.data;
                }
              }
              pdVar19 = pdVar19 + 1;
              lVar21 = lVar21 + 0x10;
            } while (pdVar22 != pdVar19);
          }
          break;
        case INT32:
          pvVar10 = vector<duckdb::Vector,_true>::operator[](&this->data,(size_type)pdVar22);
          pdVar22 = (data_ptr_t)this->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
          Vector::ToUnifiedFormat(pvVar10,(idx_t)pdVar22,(UnifiedVectorFormat *)local_80);
          if (pdVar22 != (data_ptr_t)0x0) {
            local_a0 = (data_ptr_t)local_80._8_8_;
            lVar21 = 0;
            pdVar19 = (data_ptr_t)0x0;
            local_90 = pdVar22;
            do {
              pdVar15 = pdVar19;
              if (*(long *)local_80._0_8_ != 0) {
                pdVar15 = (data_ptr_t)(ulong)*(uint *)(*(long *)local_80._0_8_ + (long)pdVar19 * 4);
              }
              if (*(long *)((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21) != 0)
              {
                if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
                   ((*(ulong *)((long)local_70[0].sel_vector + ((ulong)pdVar15 >> 6) * 8) >>
                     ((ulong)pdVar15 & 0x3f) & 1) != 0)) {
                  uVar17 = *(uint *)(local_a0 + (long)pdVar15 * 4);
                  puVar14 = (uint *)ArenaAllocator::Allocate(allocator,4);
                  *puVar14 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                             uVar17 << 0x18;
                  *(data_t *)puVar14 = (char)(uVar17 >> 0x18) + 0x80;
                  ARTKey::ARTKey(&local_b0,(data_ptr_t)puVar14,4);
                  pdVar22 = local_b0.data;
                  iVar20 = local_b0.len;
                  pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                           super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  pdVar15 = ArenaAllocator::Allocate
                                      (allocator,
                                       *(long *)((long)&pAVar6->len + lVar21) + local_b0.len);
                  switchD_012b9b0d::default
                            (pdVar15,*(void **)((long)&pAVar6->data + lVar21),
                             *(size_t *)((long)&pAVar6->len + lVar21));
                  switchD_012b9b0d::default
                            (pdVar15 + *(long *)((long)&pAVar6->len + lVar21),pdVar22,iVar20);
                  plVar2 = (long *)((long)&pAVar6->len + lVar21);
                  *plVar2 = *plVar2 + iVar20;
                  *(data_ptr_t *)((long)&pAVar6->data + lVar21) = pdVar15;
                  pdVar22 = local_90;
                }
                else {
                  ARTKey::ARTKey(&local_b0);
                  psVar1 = (size_t *)
                           ((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21);
                  *psVar1 = local_b0.len;
                  psVar1[1] = (size_t)local_b0.data;
                }
              }
              pdVar19 = pdVar19 + 1;
              lVar21 = lVar21 + 0x10;
            } while (pdVar22 != pdVar19);
          }
          break;
        case UINT64:
          pvVar10 = vector<duckdb::Vector,_true>::operator[](&this->data,(size_type)pdVar22);
          pdVar22 = (data_ptr_t)this->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
          Vector::ToUnifiedFormat(pvVar10,(idx_t)pdVar22,(UnifiedVectorFormat *)local_80);
          if (pdVar22 != (data_ptr_t)0x0) {
            local_a0 = (data_ptr_t)local_80._8_8_;
            lVar21 = 0;
            pdVar19 = (data_ptr_t)0x0;
            local_90 = pdVar22;
            do {
              pdVar15 = pdVar19;
              if (*(long *)local_80._0_8_ != 0) {
                pdVar15 = (data_ptr_t)(ulong)*(uint *)(*(long *)local_80._0_8_ + (long)pdVar19 * 4);
              }
              if (*(long *)((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21) != 0)
              {
                if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
                   ((*(ulong *)((long)local_70[0].sel_vector + ((ulong)pdVar15 >> 6) * 8) >>
                     ((ulong)pdVar15 & 0x3f) & 1) != 0)) {
                  uVar18 = *(ulong *)(local_a0 + (long)pdVar15 * 8);
                  puVar12 = (ulong *)ArenaAllocator::Allocate(allocator,8);
                  *puVar12 = uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
                             (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
                             (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
                             (uVar18 & 0xff00) << 0x28 | uVar18 << 0x38;
                  ARTKey::ARTKey(&local_b0,(data_ptr_t)puVar12,8);
                  pdVar22 = local_b0.data;
                  iVar20 = local_b0.len;
                  pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                           super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  pdVar15 = ArenaAllocator::Allocate
                                      (allocator,
                                       *(long *)((long)&pAVar6->len + lVar21) + local_b0.len);
                  switchD_012b9b0d::default
                            (pdVar15,*(void **)((long)&pAVar6->data + lVar21),
                             *(size_t *)((long)&pAVar6->len + lVar21));
                  switchD_012b9b0d::default
                            (pdVar15 + *(long *)((long)&pAVar6->len + lVar21),pdVar22,iVar20);
                  plVar2 = (long *)((long)&pAVar6->len + lVar21);
                  *plVar2 = *plVar2 + iVar20;
                  *(data_ptr_t *)((long)&pAVar6->data + lVar21) = pdVar15;
                  pdVar22 = local_90;
                }
                else {
                  ARTKey::ARTKey(&local_b0);
                  psVar1 = (size_t *)
                           ((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21);
                  *psVar1 = local_b0.len;
                  psVar1[1] = (size_t)local_b0.data;
                }
              }
              pdVar19 = pdVar19 + 1;
              lVar21 = lVar21 + 0x10;
            } while (pdVar22 != pdVar19);
          }
          break;
        case INT64:
          pvVar10 = vector<duckdb::Vector,_true>::operator[](&this->data,(size_type)pdVar22);
          pdVar22 = (data_ptr_t)this->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
          Vector::ToUnifiedFormat(pvVar10,(idx_t)pdVar22,(UnifiedVectorFormat *)local_80);
          if (pdVar22 != (data_ptr_t)0x0) {
            local_a0 = (data_ptr_t)local_80._8_8_;
            lVar21 = 0;
            pdVar19 = (data_ptr_t)0x0;
            local_90 = pdVar22;
            do {
              pdVar15 = pdVar19;
              if (*(long *)local_80._0_8_ != 0) {
                pdVar15 = (data_ptr_t)(ulong)*(uint *)(*(long *)local_80._0_8_ + (long)pdVar19 * 4);
              }
              if (*(long *)((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21) != 0)
              {
                if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
                   ((*(ulong *)((long)local_70[0].sel_vector + ((ulong)pdVar15 >> 6) * 8) >>
                     ((ulong)pdVar15 & 0x3f) & 1) != 0)) {
                  uVar18 = *(ulong *)(local_a0 + (long)pdVar15 * 8);
                  puVar12 = (ulong *)ArenaAllocator::Allocate(allocator,8);
                  *puVar12 = uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
                             (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
                             (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
                             (uVar18 & 0xff00) << 0x28 | uVar18 << 0x38;
                  *(data_t *)puVar12 = (char)(uVar18 >> 0x38) + 0x80;
                  ARTKey::ARTKey(&local_b0,(data_ptr_t)puVar12,8);
                  pdVar22 = local_b0.data;
                  iVar20 = local_b0.len;
                  pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                           super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  pdVar15 = ArenaAllocator::Allocate
                                      (allocator,
                                       *(long *)((long)&pAVar6->len + lVar21) + local_b0.len);
                  switchD_012b9b0d::default
                            (pdVar15,*(void **)((long)&pAVar6->data + lVar21),
                             *(size_t *)((long)&pAVar6->len + lVar21));
                  switchD_012b9b0d::default
                            (pdVar15 + *(long *)((long)&pAVar6->len + lVar21),pdVar22,iVar20);
                  plVar2 = (long *)((long)&pAVar6->len + lVar21);
                  *plVar2 = *plVar2 + iVar20;
                  *(data_ptr_t *)((long)&pAVar6->data + lVar21) = pdVar15;
                  pdVar22 = local_90;
                }
                else {
                  ARTKey::ARTKey(&local_b0);
                  psVar1 = (size_t *)
                           ((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21);
                  *psVar1 = local_b0.len;
                  psVar1[1] = (size_t)local_b0.data;
                }
              }
              pdVar19 = pdVar19 + 1;
              lVar21 = lVar21 + 0x10;
            } while (pdVar22 != pdVar19);
          }
          break;
        default:
switchD_015ae197_caseD_a:
          pIVar16 = (InternalException *)__cxa_allocate_exception(0x10);
          local_80._0_8_ = local_70;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_80,"Invalid type for index","");
          InternalException::InternalException(pIVar16,(string *)local_80);
          __cxa_throw(pIVar16,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        case FLOAT:
          pvVar10 = vector<duckdb::Vector,_true>::operator[](&this->data,(size_type)pdVar22);
          iVar20 = this->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
          Vector::ToUnifiedFormat(pvVar10,iVar20,(UnifiedVectorFormat *)local_80);
          if (iVar20 != 0) {
            local_90 = (data_ptr_t)local_80._8_8_;
            lVar21 = 0;
            iVar23 = 0;
            local_38 = iVar20;
            do {
              iVar11 = iVar23;
              if (*(long *)local_80._0_8_ != 0) {
                iVar11 = (idx_t)*(uint *)(*(long *)local_80._0_8_ + iVar23 * 4);
              }
              if (*(long *)((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21) != 0)
              {
                if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
                   ((*(ulong *)((long)local_70[0].sel_vector + (iVar11 >> 6) * 8) >> (iVar11 & 0x3f)
                    & 1) != 0)) {
                  local_a0 = (data_ptr_t)
                             CONCAT44(local_a0._4_4_,*(undefined4 *)(local_90 + iVar11 * 4));
                  puVar14 = (uint *)ArenaAllocator::Allocate(allocator,4);
                  if ((local_a0._0_4_ != 0.0) || (uVar17 = 0x80000000, NAN(local_a0._0_4_))) {
                    bVar9 = Value::IsNan<float>(local_a0._0_4_);
                    uVar17 = 0xffffffff;
                    if (((!bVar9) && (uVar17 = 0xfffffffe, local_a0._0_4_ <= 3.4028235e+38)) &&
                       (uVar17 = 0, -3.4028235e+38 <= local_a0._0_4_)) {
                      uVar17 = ~(uint)local_a0._0_4_;
                      if (-1 < (int)local_a0._0_4_) {
                        uVar17 = (uint)local_a0._0_4_ | 0x80000000;
                      }
                    }
                  }
                  *puVar14 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                             uVar17 << 0x18;
                  ARTKey::ARTKey(&local_b0,(data_ptr_t)puVar14,4);
                  pdVar22 = local_b0.data;
                  iVar20 = local_b0.len;
                  pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                           super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  pdVar19 = ArenaAllocator::Allocate
                                      (allocator,
                                       *(long *)((long)&pAVar6->len + lVar21) + local_b0.len);
                  switchD_012b9b0d::default
                            (pdVar19,*(void **)((long)&pAVar6->data + lVar21),
                             *(size_t *)((long)&pAVar6->len + lVar21));
                  switchD_012b9b0d::default
                            (pdVar19 + *(long *)((long)&pAVar6->len + lVar21),pdVar22,iVar20);
                  plVar2 = (long *)((long)&pAVar6->len + lVar21);
                  *plVar2 = *plVar2 + iVar20;
                  *(data_ptr_t *)((long)&pAVar6->data + lVar21) = pdVar19;
                  iVar20 = local_38;
                }
                else {
                  ARTKey::ARTKey(&local_b0);
                  psVar1 = (size_t *)
                           ((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21);
                  *psVar1 = local_b0.len;
                  psVar1[1] = (size_t)local_b0.data;
                }
              }
              iVar23 = iVar23 + 1;
              lVar21 = lVar21 + 0x10;
            } while (iVar20 != iVar23);
          }
          break;
        case DOUBLE:
          pvVar10 = vector<duckdb::Vector,_true>::operator[](&this->data,(size_type)pdVar22);
          iVar20 = this->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
          Vector::ToUnifiedFormat(pvVar10,iVar20,(UnifiedVectorFormat *)local_80);
          if (iVar20 != 0) {
            local_90 = (data_ptr_t)local_80._8_8_;
            lVar21 = 0;
            iVar23 = 0;
            local_38 = iVar20;
            do {
              iVar11 = iVar23;
              if (*(long *)local_80._0_8_ != 0) {
                iVar11 = (idx_t)*(uint *)(*(long *)local_80._0_8_ + iVar23 * 4);
              }
              if (*(long *)((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21) != 0)
              {
                if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
                   ((*(ulong *)((long)local_70[0].sel_vector + (iVar11 >> 6) * 8) >> (iVar11 & 0x3f)
                    & 1) != 0)) {
                  local_a0 = *(data_ptr_t *)(local_90 + iVar11 * 8);
                  puVar12 = (ulong *)ArenaAllocator::Allocate(allocator,8);
                  if (((double)local_a0 != 0.0) ||
                     (uVar18 = 0x8000000000000000, NAN((double)local_a0))) {
                    bVar9 = Value::IsNan<double>((double)local_a0);
                    uVar18 = 0xffffffffffffffff;
                    if ((!bVar9) &&
                       (uVar18 = 0xfffffffffffffffe, (double)local_a0 <= 1.79769313486232e+308)) {
                      if (-1.79769313486232e+308 <= (double)local_a0) {
                        uVar18 = ~(ulong)local_a0;
                        if (-1 < (long)local_a0) {
                          uVar18 = (ulong)local_a0 | 0x8000000000000000;
                        }
                      }
                      else {
                        uVar18 = 0;
                      }
                    }
                  }
                  *puVar12 = uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
                             (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
                             (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
                             (uVar18 & 0xff00) << 0x28 | uVar18 << 0x38;
                  ARTKey::ARTKey(&local_b0,(data_ptr_t)puVar12,8);
                  pdVar22 = local_b0.data;
                  iVar20 = local_b0.len;
                  pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                           super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  pdVar19 = ArenaAllocator::Allocate
                                      (allocator,
                                       *(long *)((long)&pAVar6->len + lVar21) + local_b0.len);
                  switchD_012b9b0d::default
                            (pdVar19,*(void **)((long)&pAVar6->data + lVar21),
                             *(size_t *)((long)&pAVar6->len + lVar21));
                  switchD_012b9b0d::default
                            (pdVar19 + *(long *)((long)&pAVar6->len + lVar21),pdVar22,iVar20);
                  plVar2 = (long *)((long)&pAVar6->len + lVar21);
                  *plVar2 = *plVar2 + iVar20;
                  *(data_ptr_t *)((long)&pAVar6->data + lVar21) = pdVar19;
                  iVar20 = local_38;
                }
                else {
                  ARTKey::ARTKey(&local_b0);
                  psVar1 = (size_t *)
                           ((long)&((keys->
                                    super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->len + lVar21);
                  *psVar1 = local_b0.len;
                  psVar1[1] = (size_t)local_b0.data;
                }
              }
              iVar23 = iVar23 + 1;
              lVar21 = lVar21 + 0x10;
            } while (iVar20 != iVar23);
          }
        }
      }
      else if (PVar3 == VARCHAR) {
        pvVar10 = vector<duckdb::Vector,_true>::operator[](&this->data,(size_type)pdVar22);
        iVar20 = this->count;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
        Vector::ToUnifiedFormat(pvVar10,iVar20,(UnifiedVectorFormat *)local_80);
        if (iVar20 != 0) {
          local_90 = (data_ptr_t)local_80._8_8_;
          lVar21 = 0;
          iVar23 = 0;
          local_38 = iVar20;
          do {
            iVar11 = iVar23;
            if (*(long *)local_80._0_8_ != 0) {
              iVar11 = (idx_t)*(uint *)(*(long *)local_80._0_8_ + iVar23 * 4);
            }
            if (*(long *)((long)&((keys->
                                  super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                  super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->len + lVar21) != 0) {
              if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
                 ((*(ulong *)((long)local_70[0].sel_vector + (iVar11 >> 6) * 8) >> (iVar11 & 0x3f) &
                  1) != 0)) {
                value.value.pointer.ptr = (char *)local_90;
                value.value._0_8_ = *(undefined8 *)(local_90 + iVar11 * 0x10 + 8);
                AVar24 = ARTKey::CreateARTKey<duckdb::string_t>
                                   ((ARTKey *)allocator,
                                    *(ArenaAllocator **)(local_90 + iVar11 * 0x10),value);
                local_a0 = AVar24.data;
                __n = AVar24.len;
                pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                         super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl
                         .super__Vector_impl_data._M_start;
                pdVar22 = ArenaAllocator::Allocate
                                    (allocator,*(long *)((long)&pAVar6->len + lVar21) + __n);
                switchD_012b9b0d::default
                          (pdVar22,*(void **)((long)&pAVar6->data + lVar21),
                           *(size_t *)((long)&pAVar6->len + lVar21));
                switchD_012b9b0d::default
                          (pdVar22 + *(long *)((long)&pAVar6->len + lVar21),local_a0,__n);
                plVar2 = (long *)((long)&pAVar6->len + lVar21);
                *plVar2 = *plVar2 + __n;
                *(data_ptr_t *)((long)&pAVar6->data + lVar21) = pdVar22;
                iVar20 = local_38;
              }
              else {
                ARTKey::ARTKey(&local_b0);
                psVar1 = (size_t *)
                         ((long)&((keys->
                                  super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                  super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->len + lVar21);
                *psVar1 = local_b0.len;
                psVar1[1] = (size_t)local_b0.data;
              }
            }
            iVar23 = iVar23 + 1;
            lVar21 = lVar21 + 0x10;
          } while (iVar20 != iVar23);
        }
      }
      else if (PVar3 == UINT128) {
        pvVar10 = vector<duckdb::Vector,_true>::operator[](&this->data,(size_type)pdVar22);
        pdVar22 = (data_ptr_t)this->count;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
        Vector::ToUnifiedFormat(pvVar10,(idx_t)pdVar22,(UnifiedVectorFormat *)local_80);
        if (pdVar22 != (data_ptr_t)0x0) {
          local_a0 = (data_ptr_t)local_80._8_8_;
          lVar21 = 0;
          pdVar19 = (data_ptr_t)0x0;
          local_90 = pdVar22;
          do {
            pdVar15 = pdVar19;
            if (*(long *)local_80._0_8_ != 0) {
              pdVar15 = (data_ptr_t)(ulong)*(uint *)(*(long *)local_80._0_8_ + (long)pdVar19 * 4);
            }
            if (*(long *)((long)&((keys->
                                  super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                  super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->len + lVar21) != 0) {
              if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
                 ((*(ulong *)((long)local_70[0].sel_vector + ((ulong)pdVar15 >> 6) * 8) >>
                   ((ulong)pdVar15 & 0x3f) & 1) != 0)) {
                uVar18 = *(ulong *)(local_a0 + (long)pdVar15 * 0x10);
                uVar7 = *(ulong *)(local_a0 + (long)pdVar15 * 0x10 + 8);
                puVar12 = (ulong *)ArenaAllocator::Allocate(allocator,0x10);
                *puVar12 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                           (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                           (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                           (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
                puVar12[1] = uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
                             (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
                             (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
                             (uVar18 & 0xff00) << 0x28 | uVar18 << 0x38;
                ARTKey::ARTKey(&local_b0,(data_ptr_t)puVar12,0x10);
                pdVar22 = local_b0.data;
                iVar20 = local_b0.len;
                pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                         super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl
                         .super__Vector_impl_data._M_start;
                pdVar15 = ArenaAllocator::Allocate
                                    (allocator,*(long *)((long)&pAVar6->len + lVar21) + local_b0.len
                                    );
                switchD_012b9b0d::default
                          (pdVar15,*(void **)((long)&pAVar6->data + lVar21),
                           *(size_t *)((long)&pAVar6->len + lVar21));
                switchD_012b9b0d::default
                          (pdVar15 + *(long *)((long)&pAVar6->len + lVar21),pdVar22,iVar20);
                plVar2 = (long *)((long)&pAVar6->len + lVar21);
                *plVar2 = *plVar2 + iVar20;
                *(data_ptr_t *)((long)&pAVar6->data + lVar21) = pdVar15;
                pdVar22 = local_90;
              }
              else {
                ARTKey::ARTKey(&local_b0);
                psVar1 = (size_t *)
                         ((long)&((keys->
                                  super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                  super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->len + lVar21);
                *psVar1 = local_b0.len;
                psVar1[1] = (size_t)local_b0.data;
              }
            }
            pdVar19 = pdVar19 + 1;
            lVar21 = lVar21 + 0x10;
          } while (pdVar22 != pdVar19);
        }
      }
      else {
        if (PVar3 != INT128) goto switchD_015ae197_caseD_a;
        pvVar10 = vector<duckdb::Vector,_true>::operator[](&this->data,(size_type)pdVar22);
        pdVar22 = (data_ptr_t)this->count;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_80);
        Vector::ToUnifiedFormat(pvVar10,(idx_t)pdVar22,(UnifiedVectorFormat *)local_80);
        if (pdVar22 != (data_ptr_t)0x0) {
          local_a0 = (data_ptr_t)local_80._8_8_;
          lVar21 = 0;
          pdVar19 = (data_ptr_t)0x0;
          local_90 = pdVar22;
          do {
            pdVar15 = pdVar19;
            if (*(long *)local_80._0_8_ != 0) {
              pdVar15 = (data_ptr_t)(ulong)*(uint *)(*(long *)local_80._0_8_ + (long)pdVar19 * 4);
            }
            if (*(long *)((long)&((keys->
                                  super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                  super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->len + lVar21) != 0) {
              if (((unsigned_long *)local_70[0].sel_vector == (unsigned_long *)0x0) ||
                 ((*(ulong *)((long)local_70[0].sel_vector + ((ulong)pdVar15 >> 6) * 8) >>
                   ((ulong)pdVar15 & 0x3f) & 1) != 0)) {
                uVar18 = *(ulong *)(local_a0 + (long)pdVar15 * 0x10);
                uVar7 = *(ulong *)(local_a0 + (long)pdVar15 * 0x10 + 8);
                puVar12 = (ulong *)ArenaAllocator::Allocate(allocator,0x10);
                *puVar12 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                           (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                           (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                           (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
                *(data_t *)puVar12 = (char)(uVar7 >> 0x38) + 0x80;
                puVar12[1] = uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
                             (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
                             (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
                             (uVar18 & 0xff00) << 0x28 | uVar18 << 0x38;
                ARTKey::ARTKey(&local_b0,(data_ptr_t)puVar12,0x10);
                pdVar22 = local_b0.data;
                iVar20 = local_b0.len;
                pAVar6 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                         super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl
                         .super__Vector_impl_data._M_start;
                pdVar15 = ArenaAllocator::Allocate
                                    (allocator,*(long *)((long)&pAVar6->len + lVar21) + local_b0.len
                                    );
                switchD_012b9b0d::default
                          (pdVar15,*(void **)((long)&pAVar6->data + lVar21),
                           *(size_t *)((long)&pAVar6->len + lVar21));
                switchD_012b9b0d::default
                          (pdVar15 + *(long *)((long)&pAVar6->len + lVar21),pdVar22,iVar20);
                plVar2 = (long *)((long)&pAVar6->len + lVar21);
                *plVar2 = *plVar2 + iVar20;
                *(data_ptr_t *)((long)&pAVar6->data + lVar21) = pdVar15;
                pdVar22 = local_90;
              }
              else {
                ARTKey::ARTKey(&local_b0);
                psVar1 = (size_t *)
                         ((long)&((keys->
                                  super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                                  super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->len + lVar21);
                *psVar1 = local_b0.len;
                psVar1[1] = (size_t)local_b0.data;
              }
            }
            pdVar19 = pdVar19 + 1;
            lVar21 = lVar21 + 0x10;
          } while (pdVar22 != pdVar19);
        }
      }
      if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
      }
      pdVar22 = local_88;
      this = local_98;
      if (local_70[0].selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70[0].selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      pdVar22 = pdVar22 + 1;
    } while (pdVar22 < (data_ptr_t)
                       (((long)(this->data).
                               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->data).
                               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5))
    ;
  }
  return;
}

Assistant:

void GenerateKeysInternal(ArenaAllocator &allocator, DataChunk &input, unsafe_vector<ARTKey> &keys) {
	switch (input.data[0].GetType().InternalType()) {
	case PhysicalType::BOOL:
		TemplatedGenerateKeys<bool, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::INT8:
		TemplatedGenerateKeys<int8_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::INT16:
		TemplatedGenerateKeys<int16_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::INT32:
		TemplatedGenerateKeys<int32_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::INT64:
		TemplatedGenerateKeys<int64_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::INT128:
		TemplatedGenerateKeys<hugeint_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::UINT8:
		TemplatedGenerateKeys<uint8_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::UINT16:
		TemplatedGenerateKeys<uint16_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::UINT32:
		TemplatedGenerateKeys<uint32_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::UINT64:
		TemplatedGenerateKeys<uint64_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::UINT128:
		TemplatedGenerateKeys<uhugeint_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::FLOAT:
		TemplatedGenerateKeys<float, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::DOUBLE:
		TemplatedGenerateKeys<double, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::VARCHAR:
		TemplatedGenerateKeys<string_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	default:
		throw InternalException("Invalid type for index");
	}

	// We concatenate the keys for each remaining column of a compound key.
	for (idx_t i = 1; i < input.ColumnCount(); i++) {
		switch (input.data[i].GetType().InternalType()) {
		case PhysicalType::BOOL:
			ConcatenateKeys<bool, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::INT8:
			ConcatenateKeys<int8_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::INT16:
			ConcatenateKeys<int16_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::INT32:
			ConcatenateKeys<int32_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::INT64:
			ConcatenateKeys<int64_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::INT128:
			ConcatenateKeys<hugeint_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::UINT8:
			ConcatenateKeys<uint8_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::UINT16:
			ConcatenateKeys<uint16_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::UINT32:
			ConcatenateKeys<uint32_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::UINT64:
			ConcatenateKeys<uint64_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::UINT128:
			ConcatenateKeys<uhugeint_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::FLOAT:
			ConcatenateKeys<float, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::DOUBLE:
			ConcatenateKeys<double, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::VARCHAR:
			ConcatenateKeys<string_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		default:
			throw InternalException("Invalid type for index");
		}
	}
}